

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  char *__dest;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var1;
  ImGuiContext *pIVar2;
  char *pcVar3;
  ImGuiSettingsHandler *pIVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  ImGuiSettingsHandler *local_a8;
  int local_7c;
  int handler_n_1;
  char *name_start;
  char *type_end;
  char *type_start;
  char *name_end;
  char *line;
  char *line_end;
  ImGuiSettingsHandler *entry_handler;
  void *entry_data;
  int handler_n;
  char *buf_end;
  char *buf;
  ImGuiContext *g;
  size_t ini_size_local;
  char *ini_data_local;
  
  pIVar2 = GImGui;
  if ((GImGui->Initialized & 1U) != 0) {
    g = (ImGuiContext *)ini_size;
    if (ini_size == 0) {
      g = (ImGuiContext *)strlen(ini_data);
    }
    ImVector<char>::resize(&(pIVar2->SettingsIniData).Buf,(int)g + 1);
    __dest = (pIVar2->SettingsIniData).Buf.Data;
    pcVar3 = __dest + (long)g;
    memcpy(__dest,ini_data,(size_t)g);
    *pcVar3 = '\0';
    for (entry_data._4_4_ = 0; entry_data._4_4_ < (pIVar2->SettingsHandlers).Size;
        entry_data._4_4_ = entry_data._4_4_ + 1) {
      pIVar4 = ImVector<ImGuiSettingsHandler>::operator[]
                         (&pIVar2->SettingsHandlers,entry_data._4_4_);
      if (pIVar4->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        pIVar4 = ImVector<ImGuiSettingsHandler>::operator[]
                           (&pIVar2->SettingsHandlers,entry_data._4_4_);
        p_Var1 = pIVar4->ReadInitFn;
        pIVar4 = ImVector<ImGuiSettingsHandler>::operator[]
                           (&pIVar2->SettingsHandlers,entry_data._4_4_);
        (*p_Var1)(pIVar2,pIVar4);
      }
    }
    entry_handler = (ImGuiSettingsHandler *)0x0;
    line_end = (char *)0x0;
    name_end = __dest;
    while (name_end < pcVar3) {
      while( true ) {
        bVar7 = true;
        if (*name_end != '\n') {
          bVar7 = *name_end == '\r';
        }
        if (!bVar7) break;
        name_end = name_end + 1;
      }
      line = name_end;
      while( true ) {
        bVar7 = false;
        if ((line < pcVar3) && (bVar7 = false, *line != '\n')) {
          bVar7 = *line != '\r';
        }
        if (!bVar7) break;
        line = line + 1;
      }
      *line = '\0';
      if (*name_end != ';') {
        if (((*name_end == '[') && (name_end < line)) && (line[-1] == ']')) {
          line[-1] = '\0';
          pcVar5 = ImStrchrRange(name_end + 1,line + -1,']');
          if ((pcVar5 != (char *)0x0) &&
             (pcVar6 = ImStrchrRange(pcVar5 + 1,line + -1,'['), pcVar6 != (char *)0x0)) {
            *pcVar5 = '\0';
            line_end = (char *)FindSettingsHandler(name_end + 1);
            if ((ImGuiSettingsHandler *)line_end == (ImGuiSettingsHandler *)0x0) {
              local_a8 = (ImGuiSettingsHandler *)0x0;
            }
            else {
              local_a8 = (ImGuiSettingsHandler *)
                         (*((ImGuiSettingsHandler *)line_end)->ReadOpenFn)
                                   (pIVar2,(ImGuiSettingsHandler *)line_end,pcVar6 + 1);
            }
            entry_handler = local_a8;
          }
        }
        else if ((line_end != (char *)0x0) && (entry_handler != (ImGuiSettingsHandler *)0x0)) {
          (**(code **)(line_end + 0x28))(pIVar2,line_end,entry_handler,name_end);
        }
      }
      name_end = line + 1;
    }
    pIVar2->SettingsLoaded = true;
    memcpy(__dest,ini_data,(size_t)g);
    for (local_7c = 0; local_7c < (pIVar2->SettingsHandlers).Size; local_7c = local_7c + 1) {
      pIVar4 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_7c);
      if (pIVar4->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        pIVar4 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_7c);
        p_Var1 = pIVar4->ApplyAllFn;
        pIVar4 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_7c);
        (*p_Var1)(pIVar2,pIVar4);
      }
    }
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x2cb2,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ReadInitFn)
            g.SettingsHandlers[handler_n].ReadInitFn(&g, &g.SettingsHandlers[handler_n]);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ApplyAllFn)
            g.SettingsHandlers[handler_n].ApplyAllFn(&g, &g.SettingsHandlers[handler_n]);
}